

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

int evfilt_proc_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *ptr)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDI;
  uint status;
  siginfo_t info;
  uint uVar2;
  filter *in_stack_ffffffffffffff50;
  int local_a8;
  undefined4 local_98;
  int local_4;
  
  uVar2 = 0;
  *in_RDI = *in_RCX;
  in_RDI[1] = in_RCX[1];
  in_RDI[2] = in_RCX[2];
  in_RDI[3] = in_RCX[3];
  iVar1 = waitid(P_PID,(__id_t)*in_RCX,(siginfo_t *)&stack0xffffffffffffff50,0x1000005);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else {
    if (local_a8 == 1) {
      uVar2 = local_98 << 8;
    }
    else if (local_a8 == 2) {
      uVar2 = local_98 & 0x7f;
    }
    else {
      if (local_a8 != 3) {
        return 0;
      }
      uVar2 = local_98 & 0x7f | uVar2 | 0x80;
    }
    in_RDI[2] = (ulong)uVar2;
    *(ushort *)((long)in_RDI + 10) = *(ushort *)((long)in_RDI + 10) | 0x8000;
    iVar1 = knote_copyout_flag_actions(in_stack_ffffffffffffff50,(knote *)CONCAT44(uVar2,local_a8));
    if (iVar1 < 0) {
      local_4 = -1;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int
evfilt_proc_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, UNUSED_NDEBUG void *ptr)
{
    siginfo_t info;
    unsigned int status = 0;
#ifndef NDEBUG
    struct epoll_event * const ev = (struct epoll_event *) ptr;
#endif

    dbg_printf("epoll_ev=%s", epoll_event_dump(ev));
    memcpy(dst, &src->kev, sizeof(*dst)); /* Populate flags from the src kevent */

    /* Get the exit status _without_ reaping the process, waitpid() should still work in the caller */
    if (waitid(P_PID, (id_t)src->kev.ident, &info, WEXITED | WNOHANG | WNOWAIT) < 0) {
        dbg_printf("waitid(2): %s", strerror(errno));
        return (-1);
    }

    /*
     *  Try and reconstruct the status code that would have been
     *  returned by waitpid.  The OpenBSD man pages
     *  and observations of the macOS kqueue confirm this is what
     *  we should be returning in the data field of the kevent.
     */
    switch (info.si_code) {
    case CLD_EXITED:    /* WIFEXITED - High byte contains status, low byte zeroed */
        status = info.si_status << 8;
        dbg_printf("pid=%u exited, status %u", (unsigned int)src->kev.ident, status);
        break;

    case CLD_DUMPED:    /* WIFSIGNALED/WCOREDUMP - Core flag set - Low 7 bits contains fatal signal */
        status |= 0x80; /* core flag */
        status |= info.si_status & 0x7f;
        dbg_printf("pid=%u dumped, status %u", (unsigned int)src->kev.ident, status);
        break;

    case CLD_KILLED:    /* WIFSIGNALED - Low 7 bits contains fatal signal */
        status = info.si_status & 0x7f;
        dbg_printf("pid=%u signalled, status %u", (unsigned int)src->kev.ident, status);
        break;

    default: /* The rest aren't valid exit states */
        return (0);
    }

    dst->data = status;
    dst->flags |= EV_EOF; /* Set in macOS and FreeBSD kqueue implementations */

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}